

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

DotProductLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_dot(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x10e) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x10e;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    DotProductLayerParams::DotProductLayerParams(this_00.dot_);
    (this->layer_).dot_ = (DotProductLayerParams *)this_00;
  }
  return (DotProductLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::DotProductLayerParams* NeuralNetworkLayer::mutable_dot() {
  if (!has_dot()) {
    clear_layer();
    set_has_dot();
    layer_.dot_ = new ::CoreML::Specification::DotProductLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.dot)
  return layer_.dot_;
}